

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O0

void nsvg__roundCap(NSVGrasterizer *r,NSVGpoint *left,NSVGpoint *right,NSVGpoint *p,float dx,
                   float dy,float lineWidth,int ncap,int connect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float x1;
  float y;
  float x;
  float ay;
  float ax;
  float a;
  float prevy;
  float prevx;
  float ry;
  float rx;
  float ly;
  float lx;
  float dly;
  float dlx;
  float py;
  float px;
  float w;
  int i;
  int connect_local;
  int ncap_local;
  float lineWidth_local;
  float dy_local;
  float dx_local;
  NSVGpoint *p_local;
  NSVGpoint *right_local;
  NSVGpoint *left_local;
  NSVGrasterizer *r_local;
  
  fVar1 = p->x;
  fVar2 = p->y;
  rx = 0.0;
  ry = 0.0;
  prevx = 0.0;
  prevy = 0.0;
  a = 0.0;
  ax = 0.0;
  for (px = 0.0; (int)px < ncap; px = (float)((int)px + 1)) {
    fVar4 = ((float)(int)px / (float)(ncap + -1)) * 3.1415927;
    fVar5 = cosf(fVar4);
    fVar5 = fVar5 * lineWidth * 0.5;
    fVar4 = sinf(fVar4);
    fVar4 = fVar4 * lineWidth * 0.5;
    x1 = -dx * fVar4 + -dy * fVar5 + fVar1;
    fVar4 = -dy * fVar4 + --dx * fVar5 + fVar2;
    if (0 < (int)px) {
      nsvg__addEdge(r,a,ax,x1,fVar4);
    }
    fVar5 = fVar4;
    fVar3 = x1;
    if ((px != 0.0) && (fVar5 = ry, fVar3 = rx, px == (float)(ncap + -1))) {
      prevy = fVar4;
      prevx = x1;
    }
    rx = fVar3;
    ry = fVar5;
    ax = fVar4;
    a = x1;
  }
  if (connect != 0) {
    nsvg__addEdge(r,left->x,left->y,rx,ry);
    nsvg__addEdge(r,prevx,prevy,right->x,right->y);
  }
  left->x = rx;
  left->y = ry;
  right->x = prevx;
  right->y = prevy;
  return;
}

Assistant:

static void nsvg__roundCap(NSVGrasterizer* r, NSVGpoint* left, NSVGpoint* right, NSVGpoint* p, float dx, float dy, float lineWidth, int ncap, int connect)
{
	int i;
	float w = lineWidth * 0.5f;
	float px = p->x, py = p->y;
	float dlx = dy, dly = -dx;
	float lx = 0, ly = 0, rx = 0, ry = 0, prevx = 0, prevy = 0;

	for (i = 0; i < ncap; i++) {
		float a = (float)i/(float)(ncap-1)*NSVG_PI;
		float ax = cosf(a) * w, ay = sinf(a) * w;
		float x = px - dlx*ax - dx*ay;
		float y = py - dly*ax - dy*ay;

		if (i > 0)
			nsvg__addEdge(r, prevx, prevy, x, y);

		prevx = x;
		prevy = y;

		if (i == 0) {
			lx = x; ly = y;
		} else if (i == ncap-1) {
			rx = x; ry = y;
		}
	}

	if (connect) {
		nsvg__addEdge(r, left->x, left->y, lx, ly);
		nsvg__addEdge(r, rx, ry, right->x, right->y);
	}

	left->x = lx; left->y = ly;
	right->x = rx; right->y = ry;
}